

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O0

void __thiscall cali::BufferedRegionProfile::BufferedRegionProfile(BufferedRegionProfile *this)

{
  BufferedRegionProfileImpl *this_00;
  BufferedRegionProfile *this_local;
  
  RegionProfile::RegionProfile(&this->super_RegionProfile);
  (this->super_RegionProfile).super_ChannelController._vptr_ChannelController =
       (_func_int **)&PTR_on_create_0054db80;
  this_00 = (BufferedRegionProfileImpl *)operator_new(0x40);
  BufferedRegionProfileImpl::BufferedRegionProfileImpl(this_00);
  std::shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl>::
  shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,void>(&this->mP,this_00);
  return;
}

Assistant:

BufferedRegionProfile::BufferedRegionProfile() : RegionProfile(), mP { new BufferedRegionProfileImpl }
{}